

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsVersion.cpp
# Opt level: O2

string * getHostName_abi_cxx11_(void)

{
  int iVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  pcVar2 = getenv("HOSTNAME");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)operator_new__(0x200);
    iVar1 = gethostname(pcVar2,0x200);
    if (iVar1 == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (in_RDI,pcVar2);
    }
    operator_delete__(pcVar2);
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (in_RDI,pcVar2);
  }
  return (string *)in_RDI;
}

Assistant:

std::string getHostName()
{
    char* temp{nullptr};
    std::string computerName;

#if defined(WIN32) || defined(_WIN32) || defined(_WIN64)
    temp = getenv("COMPUTERNAME");
    if (temp != nullptr) {
        computerName = temp;
        temp = nullptr;
    }
#else
    temp = getenv("HOSTNAME");
    if (temp != nullptr) {
        computerName = temp;
        temp = nullptr;
    } else {
#    if !defined(__CYGWIN__)
        temp = new char[512];
        if (gethostname(temp, 512) == 0) {  // success = 0, failure = -1
            computerName = temp;
        }
        delete[] temp;
#    endif
        temp = nullptr;
    }
#endif
    return computerName;
}